

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkMessage
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer pOVar7;
  FieldDescriptor *pFVar8;
  OneofDescriptor *pOVar9;
  char *pcVar10;
  FieldDescriptor **ppFVar11;
  OneofOptions *pOVar12;
  long lVar13;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  Descriptor *in_RDX;
  DescriptorBuilder *in_RSI;
  string *__s;
  string *in_RDI;
  OneofDescriptor *mutable_oneof_decl;
  OneofDescriptor *oneof_decl_2;
  int i_7;
  OneofDescriptor *oneof_decl_1;
  int i_6;
  OneofDescriptor *oneof_decl;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FieldDescriptorProto *in_stack_00000910;
  FieldDescriptor *in_stack_00000918;
  DescriptorBuilder *in_stack_00000920;
  string *in_stack_fffffffffffffc18;
  Tables *in_stack_fffffffffffffc20;
  SubstituteArg *in_stack_fffffffffffffc28;
  EnumDescriptorProto *in_stack_fffffffffffffc30;
  EnumDescriptor *in_stack_fffffffffffffc38;
  DescriptorBuilder *in_stack_fffffffffffffc40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc48;
  SubstituteArg *in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc74;
  SubstituteArg *in_stack_fffffffffffffc78;
  SubstituteArg *in_stack_fffffffffffffc80;
  string *in_stack_fffffffffffffc88;
  FieldDescriptor *in_stack_fffffffffffffc90;
  FieldDescriptorProto *in_stack_fffffffffffffc98;
  DescriptorBuilder *in_stack_fffffffffffffca0;
  undefined4 in_stack_fffffffffffffcc0;
  SubstituteArg *in_stack_fffffffffffffcc8;
  undefined4 in_stack_fffffffffffffcd0;
  SubstituteArg *in_stack_fffffffffffffcd8;
  undefined4 in_stack_fffffffffffffce0;
  SubstituteArg *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  long in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffd00;
  DescriptorBuilder *in_stack_fffffffffffffd10;
  uint local_2dc;
  string local_2d8 [32];
  string local_2b8 [32];
  OneofDescriptor *local_298;
  int local_28c;
  undefined1 local_288 [96];
  SubstituteArg local_228;
  SubstituteArg local_1f8;
  undefined1 local_1c8 [48];
  SubstituteArg local_198;
  SubstituteArg local_168;
  SubstituteArg local_138 [3];
  string local_a8 [48];
  string local_78 [32];
  string local_58 [32];
  OneofDescriptor *local_38;
  uint local_30;
  int local_2c;
  int local_28;
  int local_24;
  undefined4 in_stack_ffffffffffffffe0;
  int iVar14;
  int iVar15;
  
  if ((in_RSI->options_to_interpret_).
      super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
      ._M_impl.super__Vector_impl_data._M_finish == (pointer)0x0) {
    pOVar7 = (pointer)MessageOptions::default_instance();
    (in_RSI->options_to_interpret_).
    super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
    ._M_impl.super__Vector_impl_data._M_finish = pOVar7;
  }
  iVar15 = 0;
  while( true ) {
    iVar14 = iVar15;
    iVar2 = Descriptor::nested_type_count((Descriptor *)in_RSI);
    if (iVar2 <= iVar15) break;
    in_stack_fffffffffffffcf8 = *(long *)&in_RSI->filename_ + (long)iVar14 * 0x90;
    DescriptorProto::nested_type
              ((DescriptorProto *)in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    CrossLinkMessage(in_RSI,in_RDX,(DescriptorProto *)CONCAT44(iVar14,in_stack_ffffffffffffffe0));
    iVar15 = iVar14 + 1;
  }
  iVar14 = 0;
  while( true ) {
    iVar2 = iVar14;
    iVar3 = Descriptor::enum_type_count((Descriptor *)in_RSI);
    if (iVar3 <= iVar14) break;
    in_stack_fffffffffffffce8 =
         (SubstituteArg *)((in_RSI->filename_)._M_string_length + (long)iVar2 * 0x50);
    DescriptorProto::enum_type
              ((DescriptorProto *)in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    CrossLinkEnum(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38,in_stack_fffffffffffffc30);
    iVar14 = iVar2 + 1;
  }
  local_24 = 0;
  while( true ) {
    iVar2 = local_24;
    iVar3 = Descriptor::field_count((Descriptor *)in_RSI);
    if (iVar3 <= iVar2) break;
    in_stack_fffffffffffffcd8 =
         (SubstituteArg *)
         ((long)(in_RSI->options_to_interpret_).
                super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage + (long)local_24 * 0x98);
    DescriptorProto::field
              ((DescriptorProto *)in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    CrossLinkField(in_stack_00000920,in_stack_00000918,in_stack_00000910);
    local_24 = local_24 + 1;
  }
  local_28 = 0;
  while( true ) {
    iVar3 = local_28;
    iVar4 = Descriptor::extension_count((Descriptor *)in_RSI);
    if (iVar4 <= iVar3) break;
    in_stack_fffffffffffffcc8 =
         (SubstituteArg *)
         (*(long *)((long)&(in_RSI->filename_).field_2 + 8) + (long)local_28 * 0x98);
    DescriptorProto::extension
              ((DescriptorProto *)in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    CrossLinkField(in_stack_00000920,in_stack_00000918,in_stack_00000910);
    local_28 = local_28 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar4 = local_2c;
    iVar5 = Descriptor::extension_range_count((Descriptor *)in_RSI);
    if (iVar5 <= iVar4) break;
    DescriptorProto::extension_range
              ((DescriptorProto *)in_stack_fffffffffffffc20,
               (int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
    CrossLinkExtensionRange
              ((DescriptorBuilder *)in_stack_fffffffffffffc20,
               (ExtensionRange *)in_stack_fffffffffffffc18,(ExtensionRange *)0x4cd5cd);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    uVar1 = local_30;
    iVar5 = Descriptor::field_count((Descriptor *)in_RSI);
    if (iVar5 <= (int)uVar1) break;
    __s = (string *)(ulong)local_30;
    pFVar8 = Descriptor::field((Descriptor *)in_RSI,local_30);
    local_38 = FieldDescriptor::containing_oneof(pFVar8);
    if (local_38 != (OneofDescriptor *)0x0) {
      iVar6 = OneofDescriptor::field_count(local_38);
      iVar5 = extraout_EDX;
      if (0 < iVar6) {
        __s = (string *)(ulong)(local_30 - 1);
        pFVar8 = Descriptor::field((Descriptor *)in_RSI,local_30 - 1);
        pOVar9 = FieldDescriptor::containing_oneof(pFVar8);
        iVar5 = extraout_EDX_00;
        if (pOVar9 != local_38) {
          Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
          std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
          pFVar8 = Descriptor::field((Descriptor *)in_RSI,local_30 - 1);
          in_stack_fffffffffffffca0 = (DescriptorBuilder *)FieldDescriptor::name_abi_cxx11_(pFVar8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc28,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffc20);
          in_stack_fffffffffffffc98 =
               DescriptorProto::field
                         ((DescriptorProto *)in_stack_fffffffffffffc20,
                          (int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
          in_stack_fffffffffffffc90 = Descriptor::field((Descriptor *)in_RSI,local_30 - 1);
          in_stack_fffffffffffffc88 = FieldDescriptor::name_abi_cxx11_(in_stack_fffffffffffffc90);
          strings::internal::SubstituteArg::SubstituteArg
                    ((SubstituteArg *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          in_stack_fffffffffffffc80 = (SubstituteArg *)OneofDescriptor::name_abi_cxx11_(local_38);
          strings::internal::SubstituteArg::SubstituteArg
                    ((SubstituteArg *)in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
          strings::internal::SubstituteArg::SubstituteArg(local_138);
          strings::internal::SubstituteArg::SubstituteArg(&local_168);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_1c8 + 0x30));
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_1c8);
          strings::internal::SubstituteArg::SubstituteArg(&local_1f8);
          strings::internal::SubstituteArg::SubstituteArg(&local_228);
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)(local_288 + 0x30));
          strings::internal::SubstituteArg::SubstituteArg((SubstituteArg *)local_288);
          in_stack_fffffffffffffc40 = (DescriptorBuilder *)local_288;
          in_stack_fffffffffffffc28 = &local_1f8;
          in_stack_fffffffffffffc20 = (Tables *)local_1c8;
          in_stack_fffffffffffffc18 = (string *)(local_1c8 + 0x30);
          strings::Substitute_abi_cxx11_
                    ((char *)in_stack_fffffffffffffc88,in_stack_fffffffffffffc80,
                     in_stack_fffffffffffffc78,
                     (SubstituteArg *)CONCAT44(in_stack_fffffffffffffc74,in_stack_fffffffffffffc70),
                     in_stack_fffffffffffffc68,
                     (SubstituteArg *)CONCAT44(iVar4,in_stack_fffffffffffffcc0),
                     in_stack_fffffffffffffcc8,
                     (SubstituteArg *)CONCAT44(iVar3,in_stack_fffffffffffffcd0),
                     in_stack_fffffffffffffcd8,
                     (SubstituteArg *)CONCAT44(iVar2,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffce8);
          __s = local_58;
          AddError(in_stack_fffffffffffffd10,in_RDI,
                   (Message *)CONCAT44(iVar15,in_stack_fffffffffffffd00),
                   (ErrorLocation)((ulong)in_stack_fffffffffffffcf8 >> 0x20),
                   (string *)CONCAT44(iVar14,in_stack_fffffffffffffcf0));
          std::__cxx11::string::~string(local_a8);
          std::__cxx11::string::~string(local_58);
          std::__cxx11::string::~string(local_78);
          iVar5 = extraout_EDX_01;
        }
      }
      in_stack_fffffffffffffc78 = *(SubstituteArg **)&in_RSI->had_errors_;
      pcVar10 = OneofDescriptor::index(local_38,(char *)__s,iVar5);
      *(int *)(in_stack_fffffffffffffc78[(int)pcVar10].scratch_ + 0xc) =
           *(int *)(in_stack_fffffffffffffc78[(int)pcVar10].scratch_ + 0xc) + 1;
    }
    local_30 = local_30 + 1;
  }
  local_28c = 0;
  while( true ) {
    iVar15 = local_28c;
    iVar14 = Descriptor::oneof_decl_count((Descriptor *)in_RSI);
    if (iVar14 <= iVar15) break;
    local_298 = (OneofDescriptor *)(*(long *)&in_RSI->had_errors_ + (long)local_28c * 0x30);
    iVar15 = OneofDescriptor::field_count(local_298);
    if (iVar15 == 0) {
      Descriptor::full_name_abi_cxx11_((Descriptor *)in_RSI);
      std::operator+(in_stack_fffffffffffffc48,(char *)in_stack_fffffffffffffc40);
      OneofDescriptor::name_abi_cxx11_(local_298);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffc20);
      DescriptorProto::oneof_decl
                ((DescriptorProto *)in_stack_fffffffffffffc20,
                 (int)((ulong)in_stack_fffffffffffffc18 >> 0x20));
      AddError(in_stack_fffffffffffffca0,(string *)in_stack_fffffffffffffc98,
               (Message *)in_stack_fffffffffffffc90,
               (ErrorLocation)((ulong)in_stack_fffffffffffffc88 >> 0x20),
               (char *)in_stack_fffffffffffffc80);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_2d8);
    }
    ppFVar11 = DescriptorPool::Tables::AllocateArray<google::protobuf::FieldDescriptor_const*>
                         (in_stack_fffffffffffffc20,(int)((ulong)in_stack_fffffffffffffc18 >> 0x20))
    ;
    *(FieldDescriptor ***)(local_298 + 0x20) = ppFVar11;
    *(undefined4 *)(local_298 + 0x18) = 0;
    if (*(long *)(local_298 + 0x28) == 0) {
      pOVar12 = OneofOptions::default_instance();
      *(OneofOptions **)(local_298 + 0x28) = pOVar12;
    }
    local_28c = local_28c + 1;
  }
  local_2dc = 0;
  while( true ) {
    iVar15 = Descriptor::field_count((Descriptor *)in_RSI);
    if (iVar15 <= (int)local_2dc) break;
    pcVar10 = (char *)(ulong)local_2dc;
    pFVar8 = Descriptor::field((Descriptor *)in_RSI,local_2dc);
    pOVar9 = FieldDescriptor::containing_oneof(pFVar8);
    if (pOVar9 != (OneofDescriptor *)0x0) {
      lVar13 = *(long *)&in_RSI->had_errors_;
      pcVar10 = OneofDescriptor::index(pOVar9,pcVar10,__c);
      lVar13 = lVar13 + (long)(int)pcVar10 * 0x30;
      *(undefined4 *)
       ((long)(in_RSI->options_to_interpret_).
              super__Vector_base<google::protobuf::(anonymous_namespace)::OptionsToInterpret,_std::allocator<google::protobuf::(anonymous_namespace)::OptionsToInterpret>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage +
       (long)(int)local_2dc * 0x98 + 0x48) = *(undefined4 *)(lVar13 + 0x18);
      pFVar8 = Descriptor::field((Descriptor *)in_RSI,local_2dc);
      iVar15 = *(int *)(lVar13 + 0x18);
      *(int *)(lVar13 + 0x18) = iVar15 + 1;
      *(FieldDescriptor **)(*(long *)(lVar13 + 0x20) + (long)iVar15 * 8) = pFVar8;
    }
    local_2dc = local_2dc + 1;
  }
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkMessage(Descriptor* message,
                                         const DescriptorProto& proto) {
  if (message->options_ == nullptr) {
    message->options_ = &MessageOptions::default_instance();
  }

  for (int i = 0; i < message->nested_type_count(); i++) {
    CrossLinkMessage(&message->nested_types_[i], proto.nested_type(i));
  }

  for (int i = 0; i < message->enum_type_count(); i++) {
    CrossLinkEnum(&message->enum_types_[i], proto.enum_type(i));
  }

  for (int i = 0; i < message->field_count(); i++) {
    CrossLinkField(&message->fields_[i], proto.field(i));
  }

  for (int i = 0; i < message->extension_count(); i++) {
    CrossLinkField(&message->extensions_[i], proto.extension(i));
  }

  for (int i = 0; i < message->extension_range_count(); i++) {
    CrossLinkExtensionRange(&message->extension_ranges_[i],
                            proto.extension_range(i));
  }

  // Set up field array for each oneof.

  // First count the number of fields per oneof.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      // Make sure fields belonging to the same oneof are defined consecutively.
      // This enables optimizations in codegens and reflection libraries to
      // skip fields in the oneof group, as only one of the field can be set.
      // Note that field_count() returns how many fields in this oneof we have
      // seen so far. field_count() > 0 guarantees that i > 0, so field(i-1) is
      // safe.
      if (oneof_decl->field_count() > 0 &&
          message->field(i - 1)->containing_oneof() != oneof_decl) {
        AddError(message->full_name() + "." + message->field(i - 1)->name(),
                 proto.field(i - 1), DescriptorPool::ErrorCollector::TYPE,
                 strings::Substitute(
                     "Fields in the same oneof must be defined consecutively. "
                     "\"$0\" cannot be defined before the completion of the "
                     "\"$1\" oneof definition.",
                     message->field(i - 1)->name(), oneof_decl->name()));
      }
      // Must go through oneof_decls_ array to get a non-const version of the
      // OneofDescriptor.
      ++message->oneof_decls_[oneof_decl->index()].field_count_;
    }
  }

  // Then allocate the arrays.
  for (int i = 0; i < message->oneof_decl_count(); i++) {
    OneofDescriptor* oneof_decl = &message->oneof_decls_[i];

    if (oneof_decl->field_count() == 0) {
      AddError(message->full_name() + "." + oneof_decl->name(),
               proto.oneof_decl(i), DescriptorPool::ErrorCollector::NAME,
               "Oneof must have at least one field.");
    }

    oneof_decl->fields_ = tables_->AllocateArray<const FieldDescriptor*>(
        oneof_decl->field_count_);
    oneof_decl->field_count_ = 0;

    if (oneof_decl->options_ == nullptr) {
      oneof_decl->options_ = &OneofOptions::default_instance();
    }
  }

  // Then fill them in.
  for (int i = 0; i < message->field_count(); i++) {
    const OneofDescriptor* oneof_decl = message->field(i)->containing_oneof();
    if (oneof_decl != nullptr) {
      OneofDescriptor* mutable_oneof_decl =
          &message->oneof_decls_[oneof_decl->index()];
      message->fields_[i].index_in_oneof_ = mutable_oneof_decl->field_count_;
      mutable_oneof_decl->fields_[mutable_oneof_decl->field_count_++] =
          message->field(i);
    }
  }
}